

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_unary_impl(ggml_context *ctx,ggml_tensor *a,ggml_unary_op op,_Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  
  _Var1 = ggml_is_contiguous_n(a,1);
  if (_Var1) {
    if (inplace) {
      pgVar2 = ggml_view_tensor(ctx,a);
    }
    else {
      pgVar2 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
    }
    pgVar2->op_params[0] = op;
    pgVar2->op = GGML_OP_UNARY;
    pgVar2->src[0] = a;
    return pgVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x12ff,
             "GGML_ASSERT(%s) failed","ggml_is_contiguous_1(a)");
}

Assistant:

static struct ggml_tensor * ggml_unary_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum ggml_unary_op    op,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_contiguous_1(a));

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params_i32(result, 0, (int32_t) op);

    result->op     = GGML_OP_UNARY;
    result->src[0] = a;

    return result;
}